

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O3

void __thiscall cppcms::http::context::async_flush_output(context *this,handler *h)

{
  io_mode_type iVar1;
  runtime_error *this_00;
  string local_40;
  
  iVar1 = http::response::io_mode
                    ((((this->d).ptr_)->response)._M_t.
                     super___uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cppcms::http::response_*,_std::default_delete<cppcms::http::response>_>
                     .super__Head_base<0UL,_cppcms::http::response_*,_false>._M_head_impl);
  if (iVar1 != asynchronous) {
    iVar1 = http::response::io_mode
                      ((((this->d).ptr_)->response)._M_t.
                       super___uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cppcms::http::response_*,_std::default_delete<cppcms::http::response>_>
                       .super__Head_base<0UL,_cppcms::http::response_*,_false>._M_head_impl);
    if (iVar1 != asynchronous_raw) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,
                 "Can\'t use asynchronouse operations when I/O mode is synchronous","");
      booster::runtime_error::runtime_error(this_00,&local_40);
      *(undefined ***)this_00 = &PTR__runtime_error_00284840;
      (this_00->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
      __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  cppcms::impl::cgi::connection::async_write_response
            ((this->conn_).
             super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (((this->d).ptr_)->response)._M_t.
             super___uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppcms::http::response_*,_std::default_delete<cppcms::http::response>_>
             .super__Head_base<0UL,_cppcms::http::response_*,_false>._M_head_impl,false,h);
  return;
}

Assistant:

void context::async_flush_output(context::handler const &h)
{
	if(response().io_mode() != http::response::asynchronous && response().io_mode()!=http::response::asynchronous_raw) {
		throw cppcms_error("Can't use asynchronouse operations when I/O mode is synchronous");
	}
	conn_->async_write_response(
		response(),
		false,
		h);
}